

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quuid.h
# Opt level: O1

Variant __thiscall QUuid::variant(QUuid *this)

{
  byte bVar1;
  long lVar2;
  Variant VVar3;
  long lVar4;
  
  bVar1 = this->data4[0];
  if ((char)bVar1 < '\0') {
    VVar3 = DCE;
    if (0xbf < bVar1) {
      return (uint)(bVar1 >> 5);
    }
  }
  else {
    VVar3 = NCS;
    if (this->data4[0] == '\0') {
      lVar2 = 9;
      do {
        lVar4 = lVar2;
        if (lVar4 == 0x10) goto LAB_001f9917;
        lVar2 = lVar4 + 1;
      } while (this->data4[lVar4 + -8] == '\0');
      if (6 < lVar4 - 9U) {
LAB_001f9917:
        if ((this->data1 == 0) && (this->data2 == 0)) {
          return -(uint)(this->data3 == 0);
        }
      }
    }
  }
  return VVar3;
}

Assistant:

constexpr Variant variant(QT6_DECL_NEW_OVERLOAD) const noexcept
    {
        // Check the 3 MSB of data4[0]
        const quint8 var = data4[0] & 0xE0;
        if (var < 0x80)
            return isNull(QT6_CALL_NEW_OVERLOAD) ? VarUnknown : NCS;
        if (var < 0xC0)
            return DCE;
        return Variant(var >> 5); // Microsoft or Reserved
    }